

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

char * match(MatchState *ms,char *s,char *p)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  ushort **ppuVar6;
  char *pcVar7;
  ulong uVar8;
  ptrdiff_t *ppVar9;
  byte *pbVar10;
  bool bVar11;
  
LAB_001181de:
  pbVar5 = (byte *)p;
LAB_001181e5:
  while (bVar2 = *pbVar5, bVar2 == 0x25) {
    bVar2 = pbVar5[1];
    if ((ulong)bVar2 != 0x66) {
      if (bVar2 == 0x62) {
        bVar2 = pbVar5[2];
        if ((bVar2 == 0) || (pbVar5[3] == 0)) {
          luaL_error(ms->L,"unbalanced pattern");
          bVar2 = pbVar5[2];
        }
        if (*s != bVar2) goto LAB_001184cc;
        pbVar10 = (byte *)s + 1;
        if (ms->src_end <= pbVar10) goto LAB_001184cc;
        iVar3 = 1;
        goto LAB_00118355;
      }
      ppuVar6 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar6 + (ulong)bVar2 * 2 + 1) & 8) == 0) goto LAB_001182b2;
      if (((bVar2 < 0x31) || (uVar4 = bVar2 - 0x31, ms->level <= (int)uVar4)) ||
         (ms->capture[uVar4].len == -1)) {
        uVar4 = luaL_error(ms->L,"invalid capture index");
      }
      uVar8 = ms->capture[(int)uVar4].len;
      if (((ulong)((long)ms->src_end - (long)s) < uVar8) ||
         (iVar3 = bcmp(ms->capture[(int)uVar4].init,s,uVar8), iVar3 != 0)) goto LAB_001184cc;
      if ((byte *)s == (byte *)0x0) {
        return (char *)0x0;
      }
      p = (char *)(pbVar5 + 2);
      s = (char *)((byte *)s + uVar8);
      goto LAB_001181de;
    }
    if (pbVar5[2] != 0x5b) {
      luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
    }
    pbVar10 = pbVar5 + 2;
    pbVar5 = (byte *)classend(ms,(char *)pbVar10);
    if (s == ms->src_init) {
      uVar4 = 0;
    }
    else {
      uVar4 = (uint)((byte *)s)[-1];
    }
    iVar3 = matchbracketclass(uVar4,(char *)pbVar10,(char *)(pbVar5 + -1));
    if ((iVar3 != 0) ||
       (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar10,(char *)(pbVar5 + -1)), iVar3 == 0)
       ) goto LAB_001184cc;
  }
  if (bVar2 < 0x28) {
    if (bVar2 == 0) {
      return (char *)(byte *)s;
    }
    if ((bVar2 == 0x24) && (pbVar5[1] == 0)) {
      if (s != ms->src_end) {
        return (char *)0x0;
      }
      return (char *)(byte *)s;
    }
  }
  else {
    if (bVar2 == 0x29) {
      uVar8 = (ulong)(uint)ms->level;
      ppVar9 = &ms->capture[uVar8 - 1].len;
      goto LAB_00118456;
    }
    if (bVar2 == 0x28) {
      if (pbVar5[1] == 0x29) {
        pbVar5 = pbVar5 + 2;
        iVar3 = -2;
      }
      else {
        pbVar5 = pbVar5 + 1;
        iVar3 = -1;
      }
      pcVar7 = start_capture(ms,s,(char *)pbVar5,iVar3);
      return pcVar7;
    }
  }
LAB_001182b2:
  p = classend(ms,(char *)pbVar5);
  if (s < ms->src_end) {
    iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p);
    bVar11 = iVar3 != 0;
  }
  else {
    bVar11 = false;
  }
  bVar2 = *p;
  if (bVar2 == 0x3f) {
    if ((bVar11) &&
       (pcVar7 = match(ms,(char *)((byte *)s + 1),(char *)((byte *)p + 1)), pcVar7 != (char *)0x0))
    {
      return pcVar7;
    }
    pbVar5 = (byte *)p + 1;
    goto LAB_001181e5;
  }
  if (bVar2 == 0x2a) {
LAB_00118508:
    pcVar7 = max_expand(ms,s,(char *)pbVar5,p);
    return pcVar7;
  }
  if (bVar2 == 0x2b) {
    if (bVar11) {
      s = (char *)((byte *)s + 1);
      goto LAB_00118508;
    }
  }
  else {
    if (bVar2 != 0x2d) goto code_r0x00118398;
    while( true ) {
      pcVar7 = match(ms,s,(char *)((byte *)p + 1));
      if (pcVar7 != (char *)0x0) {
        return pcVar7;
      }
      if ((ms->src_end <= s) || (iVar3 = singlematch((uint)(byte)*s,(char *)pbVar5,p), iVar3 == 0))
      break;
      s = (char *)((byte *)s + 1);
    }
  }
  goto LAB_001184cc;
LAB_00118355:
  if (*pbVar10 == pbVar5[3]) {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) goto LAB_001183a8;
  }
  else {
    iVar3 = iVar3 + (uint)(*pbVar10 == bVar2);
  }
  pbVar10 = pbVar10 + 1;
  if (pbVar10 == (byte *)ms->src_end) goto LAB_001184cc;
  goto LAB_00118355;
LAB_001183a8:
  p = (char *)(pbVar5 + 4);
  s = (char *)(pbVar10 + 1);
  goto LAB_001181de;
code_r0x00118398:
  s = (char *)((byte *)s + 1);
  if (!bVar11) goto LAB_001184cc;
  goto LAB_001181de;
  while( true ) {
    uVar4 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar4;
    lVar1 = *ppVar9;
    ppVar9 = ppVar9 + -2;
    if (lVar1 == -1) break;
LAB_00118456:
    if ((int)uVar8 < 1) {
      uVar4 = luaL_error(ms->L,"invalid pattern capture");
      break;
    }
  }
  ms->capture[(int)uVar4].len = (long)s - (long)ms->capture[(int)uVar4].init;
  pcVar7 = match(ms,s,(char *)(pbVar5 + 1));
  if (pcVar7 == (char *)0x0) {
    ms->capture[(int)uVar4].len = -1;
LAB_001184cc:
    pcVar7 = (char *)0x0;
  }
  return pcVar7;
}

Assistant:

static const char *match (MatchState *ms, const char *s, const char *p) {
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
    case '(': {  /* start capture */
      if (*(p+1) == ')')  /* position capture? */
        return start_capture(ms, s, p+2, CAP_POSITION);
      else
        return start_capture(ms, s, p+1, CAP_UNFINISHED);
    }
    case ')': {  /* end capture */
      return end_capture(ms, s, p+1);
    }
    case L_ESC: {
      switch (*(p+1)) {
        case 'b': {  /* balanced string? */
          s = matchbalance(ms, s, p+2);
          if (s == NULL) return NULL;
          p+=4; goto init;  /* else return match(ms, s, p+4); */
        }
        case 'f': {  /* frontier? */
          const char *ep; char previous;
          p += 2;
          if (*p != '[')
            luaL_error(ms->L, "missing " LUA_QL("[") " after "
                               LUA_QL("%%f") " in pattern");
          ep = classend(ms, p);  /* points to what is next */
          previous = (s == ms->src_init) ? '\0' : *(s-1);
          if (matchbracketclass(uchar(previous), p, ep-1) ||
             !matchbracketclass(uchar(*s), p, ep-1)) return NULL;
          p=ep; goto init;  /* else return match(ms, s, ep); */
        }
        default: {
          if (isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
            s = match_capture(ms, s, uchar(*(p+1)));
            if (s == NULL) return NULL;
            p+=2; goto init;  /* else return match(ms, s, p+2) */
          }
          goto dflt;  /* case default */
        }
      }
    }
    case '\0': {  /* end of pattern */
      return s;  /* match succeeded */
    }
    case '$': {
      if (*(p+1) == '\0')  /* is the `$' the last char in pattern? */
        return (s == ms->src_end) ? s : NULL;  /* check end of string */
      else goto dflt;
    }
    default: dflt: {  /* it is a pattern item */
      const char *ep = classend(ms, p);  /* points to what is next */
      int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
      switch (*ep) {
        case '?': {  /* optional */
          const char *res;
          if (m && ((res=match(ms, s+1, ep+1)) != NULL))
            return res;
          p=ep+1; goto init;  /* else return match(ms, s, ep+1); */
        }
        case '*': {  /* 0 or more repetitions */
          return max_expand(ms, s, p, ep);
        }
        case '+': {  /* 1 or more repetitions */
          return (m ? max_expand(ms, s+1, p, ep) : NULL);
        }
        case '-': {  /* 0 or more repetitions (minimum) */
          return min_expand(ms, s, p, ep);
        }
        default: {
          if (!m) return NULL;
          s++; p=ep; goto init;  /* else return match(ms, s+1, ep); */
        }
      }
    }
  }
}